

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

int * Abc_SclHashLookup(SC_Lib *p,char *pName)

{
  int iVar1;
  SC_Cell *pSVar2;
  uint local_1c;
  int i;
  char *pName_local;
  SC_Lib *p_local;
  
  local_1c = Abc_SclHashString(pName,p->nBins);
  while( true ) {
    if (p->nBins <= (int)local_1c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                    ,0x3e,"int *Abc_SclHashLookup(SC_Lib *, char *)");
    }
    if (p->pBins[(int)local_1c] == -1) break;
    pSVar2 = SC_LibCell(p,p->pBins[(int)local_1c]);
    iVar1 = strcmp(pName,pSVar2->pName);
    if (iVar1 == 0) break;
    local_1c = (int)(local_1c + 1) % p->nBins;
  }
  return p->pBins + (int)local_1c;
}

Assistant:

int * Abc_SclHashLookup( SC_Lib * p, char * pName )
{
    int i;
    for ( i = Abc_SclHashString(pName, p->nBins); i < p->nBins; i = (i + 1) % p->nBins )
        if ( p->pBins[i] == -1 || !strcmp(pName, SC_LibCell(p, p->pBins[i])->pName) )
            return p->pBins + i;
    assert( 0 );
    return NULL;
}